

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompt.c
# Opt level: O1

wchar_t prompt_init(EditLine *el)

{
  (el->el_prompt).p_func = prompt_default;
  (el->el_prompt).p_pos.h = L'\0';
  (el->el_prompt).p_pos.v = L'\0';
  (el->el_prompt).p_ignore = L'\0';
  (el->el_rprompt).p_func = prompt_default_r;
  (el->el_rprompt).p_pos.h = L'\0';
  (el->el_rprompt).p_pos.v = L'\0';
  (el->el_rprompt).p_ignore = L'\0';
  return L'\0';
}

Assistant:

libedit_private int
prompt_init(EditLine *el)
{

	el->el_prompt.p_func = prompt_default;
	el->el_prompt.p_pos.v = 0;
	el->el_prompt.p_pos.h = 0;
	el->el_prompt.p_ignore = '\0';
	el->el_rprompt.p_func = prompt_default_r;
	el->el_rprompt.p_pos.v = 0;
	el->el_rprompt.p_pos.h = 0;
	el->el_rprompt.p_ignore = '\0';
	return 0;
}